

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fourier_transforms.cc
# Opt level: O3

void recursive_fft(Complex *input,int size)

{
  long lVar1;
  Complex *pCVar2;
  float r;
  int size_00;
  ulong uVar3;
  long lVar4;
  Complex *input_00;
  Complex *b;
  ulong uVar5;
  long lVar6;
  Complex *input_01;
  Complex CVar7;
  double dVar8;
  Complex aCStack_80 [3];
  Complex temp;
  Complex local_50;
  Complex *local_48;
  ulong local_40;
  float local_38;
  float local_34;
  
  if (1 < size) {
    local_40 = (ulong)((uint)size >> 1);
    uVar5 = local_40 * 8 + 0xf & 0xfffffffffffffff0;
    lVar6 = -uVar5;
    input_01 = (Complex *)((long)aCStack_80 + lVar6 + 8);
    lVar1 = local_40 * 8;
    lVar4 = 0;
    local_48 = input;
    do {
      *(undefined8 *)((long)aCStack_80 + lVar6) = 0x103615;
      Complex::Complex((Complex *)((long)&input_01->real + lVar4));
      lVar4 = lVar4 + 8;
    } while (lVar1 - lVar4 != 0);
    input_00 = (Complex *)((long)input_01 - uVar5);
    lVar6 = 0;
    do {
      input_00[-1].real = 1.488811e-39;
      input_00[-1].imag = 0.0;
      Complex::Complex((Complex *)((long)&input_00->real + lVar6));
      pCVar2 = local_48;
      lVar6 = lVar6 + 8;
    } while (lVar1 - lVar6 != 0);
    lVar6 = 0;
    do {
      *(undefined8 *)((long)&input_01->real + lVar6) =
           *(undefined8 *)((long)&pCVar2->real + lVar6 * 2);
      *(undefined8 *)((long)&input_00->real + lVar6) =
           *(undefined8 *)((long)&pCVar2[1].real + lVar6 * 2);
      uVar5 = local_40;
      lVar6 = lVar6 + 8;
    } while (lVar1 - lVar6 != 0);
    size_00 = (int)local_40;
    input_00[-1].real = 1.488888e-39;
    input_00[-1].imag = 0.0;
    recursive_fft(input_01,size_00);
    input_00[-1].real = 1.488902e-39;
    input_00[-1].imag = 0.0;
    recursive_fft(input_00,size_00);
    local_34 = (float)size;
    uVar3 = 0;
    b = input_00;
    do {
      CVar7 = (Complex)(double)(((float)(long)uVar3 * -6.2831855) / local_34);
      temp = CVar7;
      input_00[-1].real = 1.48899e-39;
      input_00[-1].imag = 0.0;
      dVar8 = cos((double)CVar7);
      CVar7 = temp;
      local_38 = (float)dVar8;
      input_00[-1].real = 1.489017e-39;
      input_00[-1].imag = 0.0;
      dVar8 = sin((double)CVar7);
      r = local_38;
      input_00[-1].real = 1.489045e-39;
      input_00[-1].imag = 0.0;
      Complex::Complex(&local_50,r,(float)dVar8);
      input_00[-1].real = 1.489065e-39;
      input_00[-1].imag = 0.0;
      Complex::operator*(&local_50,b);
      input_00[-1].real = 1.489084e-39;
      input_00[-1].imag = 0.0;
      Complex::operator+(input_01,aCStack_80 + 2);
      local_48[uVar3] = local_50;
      input_00[-1].real = 1.48912e-39;
      input_00[-1].imag = 0.0;
      Complex::operator-(input_01,aCStack_80 + 2);
      pCVar2[uVar5 + uVar3] = local_50;
      uVar3 = uVar3 + 1;
      input_01 = input_01 + 1;
      b = b + 1;
    } while (local_40 != uVar3);
  }
  return;
}

Assistant:

void recursive_fft(Complex *input, int size) {
    if (size <= 1) {
        return;
    }

    //divide
    Complex even[size >> 1];
    Complex odd[size >> 1];
    for (size_t k = 0; k < (size >> 1); ++k) {
	    even[k] = input[k << 1];
	    odd[k] = input[(k << 1) + 1];
    }

    //recursive call
    recursive_fft(even, size >> 1);
    recursive_fft(odd, size >> 1);

    //combine
    for (size_t i = 0; i < size / 2; ++i) {
        float theta = -2 * PI * i / size;
        Complex temp = Complex(cos(theta), sin(theta)) * odd[i];
        input[i] = even[i] + temp;
        input[i + (size >> 1)] = even[i] - temp;
    }
}